

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dec_utils.c
# Opt level: O1

RK_S32 mpi_dec_opt_i(void *ctx,char *next)

{
  RK_S32 RVar1;
  
  if (next == (char *)0x0) {
    RVar1 = 0;
    _mpp_log_l(2,"mpi_dec_utils","input file is invalid\n",0);
  }
  else {
    strncpy((char *)ctx,next,0xff);
    *(undefined4 *)((long)ctx + 0x210) = 1;
    RVar1 = 1;
    if (*(int *)((long)ctx + 0x200) == 0) {
      name_to_coding_type((char *)ctx,(MppCodingType *)((long)ctx + 0x200));
    }
  }
  return RVar1;
}

Assistant:

RK_S32 mpi_dec_opt_i(void *ctx, const char *next)
{
    MpiDecTestCmd *cmd = (MpiDecTestCmd *)ctx;

    if (next) {
        strncpy(cmd->file_input, next, MAX_FILE_NAME_LENGTH - 1);
        cmd->have_input = 1;
        if (!cmd->type)
            name_to_coding_type(cmd->file_input, &cmd->type);
        return 1;
    }

    mpp_err("input file is invalid\n");
    return 0;
}